

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::FundPsbtResponse::FundPsbtResponse(FundPsbtResponse *this)

{
  allocator local_25 [20];
  allocator local_11;
  FundPsbtResponse *local_10;
  FundPsbtResponse *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::FundPsbtResponse>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::FundPsbtResponse>);
  (this->super_JsonClassBase<cfd::js::api::json::FundPsbtResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__FundPsbtResponse_01b4a9f0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->psbt_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hex_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->used_addresses_);
  this->fee_amount_ = 0;
  CollectFieldName();
  return;
}

Assistant:

FundPsbtResponse() {
    CollectFieldName();
  }